

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QSharedPointer<QRelation>_>::data(QList<QSharedPointer<QRelation>_> *this)

{
  QArrayDataPointer<QSharedPointer<QRelation>_> *this_00;
  QSharedPointer<QRelation> *pQVar1;
  QArrayDataPointer<QSharedPointer<QRelation>_> *in_RDI;
  
  detach((QList<QSharedPointer<QRelation>_> *)0x1694fc);
  this_00 = (QArrayDataPointer<QSharedPointer<QRelation>_> *)
            QArrayDataPointer<QSharedPointer<QRelation>_>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QSharedPointer<QRelation>_>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }